

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferBlitCase::render
          (FramebufferBlitCase *this,GLuint program,IVec4 *viewport)

{
  int iVar1;
  RenderContext *pRVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  long lVar5;
  
  pRVar2 = (this->super_ScissorCase).m_renderCtx;
  iVar3 = (*pRVar2->_vptr_RenderContext[3])(pRVar2,CONCAT44(in_register_00000034,program));
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = viewport->m_data[2];
  iVar1 = viewport->m_data[3];
  iVar4 = (*((this->super_ScissorCase).m_renderCtx)->_vptr_RenderContext[6])();
  (**(code **)(lVar5 + 0x78))
            (0x8ca8,(((this->m_fbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar5 + 0x78))(0x8ca9,iVar4);
  (**(code **)(lVar5 + 0x140))
            (0,0,0x40,0x40,viewport->m_data[0],viewport->m_data[1],iVar3 + viewport->m_data[0],
             iVar1 + viewport->m_data[1],0x4000,0x2600);
  (**(code **)(lVar5 + 0x78))(0x8ca8,iVar4);
  return;
}

Assistant:

void FramebufferBlitCase::render(GLuint program, const IVec4& viewport) const
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const int				width				= viewport.z();
	const int				height				= viewport.w();
	const deInt32			defaultFramebuffer	= m_renderCtx.getDefaultFramebuffer();

	DE_UNREF(program);

	// blit to default framebuffer
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, defaultFramebuffer);

	gl.blitFramebuffer(0, 0, SIZE, SIZE, viewport.x(), viewport.y(), viewport.x() + width, viewport.y() + height, GL_COLOR_BUFFER_BIT, GL_NEAREST);

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, defaultFramebuffer);
}